

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O2

void deqp::gles3::Functional::attachmentQueryRboTest(TestContext *testCtx,Context *ctx)

{
  uint in_EAX;
  uint uStack_28;
  GLint unused;
  
  uStack_28 = in_EAX;
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  (*ctx->_vptr_Context[0xc])(ctx,0x8d41,3);
  (*ctx->_vptr_Context[0x20])(ctx,0x8d40,0x8d20,0x8d41,3);
  checkFboAttachmentParam(testCtx,ctx,0x8d20,0x8cd0,0x8d41);
  checkFboAttachmentParam(testCtx,ctx,0x8d20,0x8cd1,3);
  _uStack_28 = (ulong)uStack_28;
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,0x8d20,0x8cd2,&unused);
  checkError(testCtx,ctx,0x500);
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,0x8d20,0x8cd3,&unused);
  checkError(testCtx,ctx,0x500);
  return;
}

Assistant:

static void attachmentQueryRboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	ctx.bindRenderbuffer(GL_RENDERBUFFER, 3);
	ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, 3);

	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_RENDERBUFFER);
	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, 3);

	GLint unused = 0;
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, &unused);
	checkError(testCtx, ctx, GL_INVALID_ENUM);
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, &unused);
	checkError(testCtx, ctx, GL_INVALID_ENUM);
}